

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_bindenv(HSQUIRRELVM v,SQInteger idx)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQWeakRef *pSVar3;
  SQClass *pSVar4;
  SQObjectPtr *pSVar5;
  SQObjectPtr *pSVar6;
  SQWeakRef *pSVar7;
  SQClosure *x;
  SQNativeClosure *pSVar8;
  SQRESULT SVar9;
  SQObjectPtr ret;
  
  pSVar5 = stack_get(v,idx);
  SVar2 = (pSVar5->super_SQObject)._type;
  if ((SVar2 == OT_CLOSURE) || (SVar2 == OT_NATIVECLOSURE)) {
    SVar9 = -1;
    pSVar6 = SQVM::GetUp(v,-1);
    SVar2 = (pSVar6->super_SQObject)._type;
    if ((((SVar2 == OT_ARRAY) || (SVar2 == OT_CLASS)) || (SVar2 == OT_TABLE)) ||
       (SVar2 == OT_INSTANCE)) {
      pSVar7 = SQRefCounted::GetWeakRef
                         ((pSVar6->super_SQObject)._unVal.pRefCounted,v->_sharedstate->_alloc_ctx,
                          SVar2,(pSVar6->super_SQObject)._flags);
      ret.super_SQObject._unVal.pTable = (SQTable *)0x0;
      ret.super_SQObject._type = OT_NULL;
      ret.super_SQObject._flags = '\0';
      ret.super_SQObject._5_3_ = 0;
      pSVar8 = (SQNativeClosure *)(pSVar5->super_SQObject)._unVal.pClosure;
      if ((pSVar5->super_SQObject)._type == OT_CLOSURE) {
        x = SQClosure::Clone((SQClosure *)pSVar8);
        pSVar3 = x->_env;
        if (pSVar3 != (SQWeakRef *)0x0) {
          pSVar1 = &(pSVar3->super_SQRefCounted)._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            (*(pSVar3->super_SQRefCounted)._vptr_SQRefCounted[2])();
          }
          x->_env = (SQWeakRef *)0x0;
        }
        x->_env = pSVar7;
        pSVar1 = &(pSVar7->super_SQRefCounted)._uiRef;
        *pSVar1 = *pSVar1 + 1;
        pSVar4 = ((pSVar5->super_SQObject)._unVal.pClosure)->_base;
        if (pSVar4 != (SQClass *)0x0) {
          x->_base = pSVar4;
          pSVar1 = &(pSVar4->super_SQCollectable).super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        SQObjectPtr::operator=(&ret,x);
      }
      else {
        pSVar8 = SQNativeClosure::Clone(pSVar8);
        pSVar3 = pSVar8->_env;
        if (pSVar3 != (SQWeakRef *)0x0) {
          pSVar1 = &(pSVar3->super_SQRefCounted)._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            (*(pSVar3->super_SQRefCounted)._vptr_SQRefCounted[2])();
          }
          pSVar8->_env = (SQWeakRef *)0x0;
        }
        pSVar8->_env = pSVar7;
        pSVar1 = &(pSVar7->super_SQRefCounted)._uiRef;
        *pSVar1 = *pSVar1 + 1;
        SQObjectPtr::operator=(&ret,pSVar8);
      }
      SQVM::Pop(v);
      SQVM::Push(v,&ret);
      SQObjectPtr::~SQObjectPtr(&ret);
      SVar9 = 0;
    }
    else {
      sq_throwerror(v,"invalid environment");
    }
  }
  else {
    sq_throwerror(v,"the target is not a closure");
    SVar9 = -1;
  }
  return SVar9;
}

Assistant:

SQRESULT sq_bindenv(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &o = stack_get(v,idx);
    if(!sq_isnativeclosure(o) &&
        !sq_isclosure(o))
        return sq_throwerror(v,_SC("the target is not a closure"));
    SQObjectPtr &env = stack_get(v,-1);
    if(!sq_istable(env) &&
        !sq_isarray(env) &&
        !sq_isclass(env) &&
        !sq_isinstance(env))
        return sq_throwerror(v,_SC("invalid environment"));
    SQWeakRef *w = _refcounted(env)->GetWeakRef(_ss(v)->_alloc_ctx, sq_type(env), env._flags);
    SQObjectPtr ret;
    if(sq_isclosure(o)) {
        SQClosure *c = _closure(o)->Clone();
        __ObjRelease(c->_env);
        c->_env = w;
        __ObjAddRef(c->_env);
        if(_closure(o)->_base) {
            c->_base = _closure(o)->_base;
            __ObjAddRef(c->_base);
        }
        ret = c;
    }
    else { //then must be a native closure
        SQNativeClosure *c = _nativeclosure(o)->Clone();
        __ObjRelease(c->_env);
        c->_env = w;
        __ObjAddRef(c->_env);
        ret = c;
    }
    v->Pop();
    v->Push(ret);
    return SQ_OK;
}